

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O0

int main(int argc,char **argv)

{
  uint16_t port;
  byte bVar1;
  Log *pLVar2;
  Host *pHVar3;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  undefined1 local_2a0 [8];
  SSH2Client client;
  Host *host;
  size_t i;
  vector<common::Host,_std::allocator<common::Host>_> hosts;
  Config config;
  undefined1 local_138 [8];
  XcpOptions options;
  char **argv_local;
  int argc_local;
  
  options._280_8_ = argv;
  XcpOptions::XcpOptions((XcpOptions *)local_138);
  XcpOptions::Init((XcpOptions *)local_138,argc,(char **)options._280_8_);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    pLVar2 = xlib::Log::Instance();
    std::__cxx11::string::string
              ((string *)
               &config.m_group_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)&options.super_Options.log_level);
    xlib::Log::SetLogFile
              (pLVar2,(string *)
                      &config.m_group_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &config.m_group_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (0 < options.super_Options.index) {
    pLVar2 = xlib::Log::Instance();
    xlib::Log::SetLogPriority(pLVar2,options.super_Options.index);
  }
  common::Config::Config
            ((Config *)
             &hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  common::Config::Init
            ((Config *)
             &hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)&options.super_Options.field_0xa8)
  ;
  std::vector<common::Host,_std::allocator<common::Host>_>::vector
            ((vector<common::Host,_std::allocator<common::Host>_> *)&i);
  common::Config::GetHostsByOptions
            ((Config *)
             &hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Options *)local_138,
             (vector<common::Host,_std::allocator<common::Host>_> *)&i);
  host = (Host *)0x0;
  while( true ) {
    pHVar3 = (Host *)std::vector<common::Host,_std::allocator<common::Host>_>::size
                               ((vector<common::Host,_std::allocator<common::Host>_> *)&i);
    if (pHVar3 <= host) break;
    client._216_8_ =
         std::vector<common::Host,_std::allocator<common::Host>_>::operator[]
                   ((vector<common::Host,_std::allocator<common::Host>_> *)&i,(size_type)host);
    std::__cxx11::string::string(local_2c0,(string *)&((reference)client._216_8_)->user);
    std::__cxx11::string::string(local_2e0,(string *)(client._216_8_ + 0x40));
    std::__cxx11::string::string(local_300,(string *)(client._216_8_ + 0x60));
    port = *(uint16_t *)(client._216_8_ + 0x80);
    std::__cxx11::string::string(local_320,(string *)client._216_8_);
    common::SSH2Client::SSH2Client
              ((SSH2Client *)local_2a0,(string *)local_2c0,(string *)local_2e0,(string *)local_300,
               port,(string *)local_320);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_2c0);
    common::SSH2Client::Open((SSH2Client *)local_2a0,true);
    if ((options._272_1_ & 1) != 0) {
      std::__cxx11::string::string(local_340,(string *)&options.field_0xf0);
      std::__cxx11::string::string(local_360,(string *)&options.super_Options.opt_cur);
      common::SSH2Client::Copy((SSH2Client *)local_2a0,(string *)local_340,(string *)local_360);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_340);
    }
    if ((options._273_1_ & 1) != 0) {
      std::__cxx11::string::string(local_380,(string *)&options.field_0xf0);
      std::__cxx11::string::string(local_3a0,(string *)&options.super_Options.opt_cur);
      common::SSH2Client::Send((SSH2Client *)local_2a0,(string *)local_380,(string *)local_3a0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_380);
    }
    common::SSH2Client::~SSH2Client((SSH2Client *)local_2a0);
    host = (Host *)&host->field_0x1;
  }
  std::vector<common::Host,_std::allocator<common::Host>_>::~vector
            ((vector<common::Host,_std::allocator<common::Host>_> *)&i);
  common::Config::~Config
            ((Config *)
             &hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  XcpOptions::~XcpOptions((XcpOptions *)local_138);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    XcpOptions options;
    options.Init(argc, argv);

    if (options.log_file.empty() == false) {
        xlib::Log::Instance().SetLogFile(options.log_file);
    }
    if (options.log_level > 0) {
        xlib::Log::Instance().SetLogPriority(xlib::LOG_PRIORITY(options.log_level));
    }

    common::Config config;
    config.Init(options.config_file);

    std::vector<common::Host> hosts;
    config.GetHostsByOptions(options, &hosts);
    for (size_t i = 0; i < hosts.size(); i++) {
        common::Host& host = hosts[i];
        common::SSH2Client client(
            host.user, host.password, host.ip, host.port, host.alias);
        client.Open();
        if (options.remote_to_local) {
            client.Copy(options.local_path, options.remote_path);
        }
        if (options.local_to_remote) {
            client.Send(options.local_path, options.remote_path);
        }
    }
    return 0;
}